

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O0

FT_Error sfnt_init_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_UShort FVar1;
  FT_Error FVar2;
  int iVar3;
  FT_Pointer pvVar4;
  FT_ULong FVar5;
  long lVar6;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  FT_Byte *pFStack_d0;
  FT_UInt i;
  FT_Byte *p;
  FT_ULong instance_offset;
  FT_ULong default_value_offset;
  FT_ULong array_start;
  FT_Byte *instance_values;
  FT_Byte *default_values;
  ushort local_98;
  ushort local_96;
  FT_Int instance_index;
  FT_UShort instance_size;
  FT_UShort num_instances;
  FT_UShort axis_size;
  FT_UShort num_axes;
  FT_ULong offset;
  FT_ULong version;
  FT_ULong fvar_len;
  FT_Memory memory;
  FT_Module tt_module_1;
  FT_Module tt_module;
  FT_Pointer _tmp_;
  FT_Module module;
  undefined8 *puStack_48;
  FT_Int face_index;
  SFNT_Service sfnt;
  FT_Library library;
  FT_Parameter *pFStack_30;
  FT_Error error;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_instance_index_local;
  TT_Face face_local;
  FT_Stream stream_local;
  
  sfnt = (SFNT_Service)(((face->root).driver)->root).library;
  puStack_48 = (undefined8 *)face->sfnt;
  pFStack_30 = params;
  params_local._0_4_ = num_params;
  params_local._4_4_ = face_instance_index;
  _num_params_local = face;
  face_local = (TT_Face)stream;
  if (puStack_48 == (undefined8 *)0x0) {
    puStack_48 = (undefined8 *)FT_Get_Module_Interface((FT_Library)sfnt,"sfnt");
    if (puStack_48 == (undefined8 *)0x0) {
      return 0xb;
    }
    _num_params_local->sfnt = puStack_48;
    _num_params_local->goto_table = (TT_Loader_GotoTableFunc)*puStack_48;
  }
  _tmp_ = (_num_params_local->root).driver;
  tt_module = (FT_Module)ft_module_get_service((FT_Module)_tmp_,"postscript-cmaps",'\x01');
  _num_params_local->psnames = tt_module;
  if (_num_params_local->mm == (void *)0x0) {
    tt_module_1 = FT_Get_Module((FT_Library)sfnt,"truetype");
    pvVar4 = ft_module_get_service(tt_module_1,"multi-masters",'\0');
    _num_params_local->mm = pvVar4;
  }
  if (_num_params_local->var == (void *)0x0) {
    memory = (FT_Memory)FT_Get_Module((FT_Library)sfnt,"truetype");
    pvVar4 = ft_module_get_service((FT_Module)memory,"metrics-variations",'\0');
    _num_params_local->var = pvVar4;
  }
  library._4_4_ = sfnt_open_font((FT_Stream)face_local,_num_params_local);
  if (library._4_4_ != 0) {
    return library._4_4_;
  }
  face_local = (TT_Face)(_num_params_local->root).stream;
  if ((int)params_local._4_4_ < 0) {
    local_d8 = -params_local._4_4_;
  }
  else {
    local_d8 = params_local._4_4_;
  }
  module._4_4_ = local_d8 & 0xffff;
  if ((int)params_local._4_4_ < 0) {
    module._4_4_ = module._4_4_ - 1;
  }
  if ((_num_params_local->ttc_header).count <= (long)(int)module._4_4_) {
    if (-1 < (int)params_local._4_4_) {
      return 6;
    }
    module._4_4_ = 0;
  }
  library._4_4_ =
       FT_Stream_Seek((FT_Stream)face_local,
                      (_num_params_local->ttc_header).offsets[(int)module._4_4_]);
  if (library._4_4_ != 0) {
    return library._4_4_;
  }
  library._4_4_ = (*(code *)puStack_48[0x16])(_num_params_local,face_local);
  if (library._4_4_ != 0) {
    return library._4_4_;
  }
  fvar_len = (FT_ULong)(_num_params_local->root).memory;
  instance_values = (FT_Byte *)0x0;
  array_start = 0;
  if ((int)params_local._4_4_ < 0) {
    local_dc = -params_local._4_4_;
  }
  else {
    local_dc = params_local._4_4_;
  }
  FVar2 = (*_num_params_local->goto_table)
                    (_num_params_local,0x66766172,(FT_Stream)face_local,&version);
  if (((FVar2 == 0) && (0x13 < version)) &&
     (offset = FT_Stream_ReadULong((FT_Stream)face_local,(FT_Error *)((long)&library + 4)),
     library._4_4_ == 0)) {
    FVar1 = FT_Stream_ReadUShort((FT_Stream)face_local,(FT_Error *)((long)&library + 4));
    _instance_size = (ulong)FVar1;
    if ((((library._4_4_ == 0) &&
         (library._4_4_ = FT_Stream_Skip((FT_Stream)face_local,2), library._4_4_ == 0)) &&
        ((instance_index._2_2_ =
               FT_Stream_ReadUShort((FT_Stream)face_local,(FT_Error *)((long)&library + 4)),
         library._4_4_ == 0 &&
         ((instance_index._0_2_ =
                FT_Stream_ReadUShort((FT_Stream)face_local,(FT_Error *)((long)&library + 4)),
          library._4_4_ == 0 &&
          (local_96 = FT_Stream_ReadUShort((FT_Stream)face_local,(FT_Error *)((long)&library + 4)),
          library._4_4_ == 0)))))) &&
       (local_98 = FT_Stream_ReadUShort((FT_Stream)face_local,(FT_Error *)((long)&library + 4)),
       library._4_4_ == 0)) goto LAB_0018ca7f;
  }
  offset = 0;
  _instance_size = 0;
  instance_index._2_2_ = 0;
  instance_index._0_2_ = 0;
  local_96 = 0;
  local_98 = 0;
LAB_0018ca7f:
  if (((((offset == 0x10000) && ((FT_UShort)instance_index == 0x14)) && (instance_index._2_2_ != 0))
      && ((instance_index._2_2_ < 0x3fff &&
          (((uint)local_98 == (uint)instance_index._2_2_ * 4 + 4 ||
           ((uint)local_98 == (uint)instance_index._2_2_ * 4 + 6)))))) &&
     ((local_96 < 0x7f00 &&
      (_instance_size + (long)(int)((uint)instance_index._2_2_ * 0x14) +
       (long)(int)((uint)local_98 * (uint)local_96) <= version)))) {
    _num_params_local->variation_support = _num_params_local->variation_support | 1;
  }
  else {
    local_96 = 0;
  }
  if ((((_num_params_local->variation_support & 1) != 0) &&
      (instance_values =
            (FT_Byte *)
            ft_mem_alloc((FT_Memory)fvar_len,(long)(int)((uint)instance_index._2_2_ << 2),
                         (FT_Error *)((long)&library + 4)), library._4_4_ == 0)) &&
     (array_start = (FT_ULong)
                    ft_mem_alloc((FT_Memory)fvar_len,(long)(int)((uint)instance_index._2_2_ << 2),
                                 (FT_Error *)((long)&library + 4)), library._4_4_ == 0)) {
    FVar5 = FT_Stream_Pos((FT_Stream)face_local);
    lVar6 = (FVar5 - 0x10) + _instance_size;
    instance_offset = lVar6 + 8;
    pFStack_d0 = instance_values;
    for (local_d4 = 0; local_d4 < instance_index._2_2_; local_d4 = local_d4 + 1) {
      library._4_4_ = FT_Stream_ReadAt((FT_Stream)face_local,instance_offset,pFStack_d0,4);
      instance_offset = (FT_UShort)instance_index + instance_offset;
      pFStack_d0 = pFStack_d0 + 4;
    }
    p = (FT_Byte *)(lVar6 + (int)((uint)(FT_UShort)instance_index * (uint)instance_index._2_2_) + 4)
    ;
    for (local_d4 = 0; local_d4 < local_96; local_d4 = local_d4 + 1) {
      library._4_4_ =
           FT_Stream_ReadAt((FT_Stream)face_local,(FT_ULong)p,(FT_Byte *)array_start,
                            (long)(int)((uint)instance_index._2_2_ << 2));
      iVar3 = memcmp(instance_values,(void *)array_start,
                     (long)(int)((uint)instance_index._2_2_ << 2));
      if (iVar3 == 0) break;
      p = p + local_98;
    }
    if (local_d4 == local_96) {
      local_96 = local_96 + 1;
    }
  }
  ft_mem_free((FT_Memory)fvar_len,instance_values);
  ft_mem_free((FT_Memory)fvar_len,(void *)array_start);
  FVar2 = (*_num_params_local->goto_table)
                    (_num_params_local,0x676c7966,(FT_Stream)face_local,(FT_ULong *)0x0);
  if (((FVar2 != 0) &&
      (FVar2 = (*_num_params_local->goto_table)
                         (_num_params_local,0x43464632,(FT_Stream)face_local,(FT_ULong *)0x0),
      FVar2 != 0)) &&
     (FVar2 = (*_num_params_local->goto_table)
                        (_num_params_local,0x43464620,(FT_Stream)face_local,(FT_ULong *)0x0),
     FVar2 == 0)) {
    local_96 = 0;
  }
  if ((int)(uint)local_96 < (int)local_dc >> 0x10) {
    if (-1 < (int)params_local._4_4_) {
      return 6;
    }
    local_96 = 0;
  }
  (_num_params_local->root).style_flags = (ulong)local_96 << 0x10;
  (_num_params_local->root).num_faces = (_num_params_local->ttc_header).count;
  (_num_params_local->root).face_index = (long)(int)params_local._4_4_;
  return library._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_init_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
    FT_Library    library = face->root.driver->root.library;
    SFNT_Service  sfnt;
    FT_Int        face_index;


    /* for now, parameters are unused */
    FT_UNUSED( num_params );
    FT_UNUSED( params );


    sfnt = (SFNT_Service)face->sfnt;
    if ( !sfnt )
    {
      sfnt = (SFNT_Service)FT_Get_Module_Interface( library, "sfnt" );
      if ( !sfnt )
      {
        FT_ERROR(( "sfnt_init_face: cannot access `sfnt' module\n" ));
        return FT_THROW( Missing_Module );
      }

      face->sfnt       = sfnt;
      face->goto_table = sfnt->goto_table;
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, face->psnames, POSTSCRIPT_CMAPS );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( !face->mm )
    {
      /* we want the MM interface from the `truetype' module only */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->mm = ft_module_get_service( tt_module,
                                        FT_SERVICE_ID_MULTI_MASTERS,
                                        0 );
    }

    if ( !face->var )
    {
      /* we want the metrics variations interface */
      /* from the `truetype' module only          */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->var = ft_module_get_service( tt_module,
                                         FT_SERVICE_ID_METRICS_VARIATIONS,
                                         0 );
    }
#endif

    FT_TRACE2(( "SFNT driver\n" ));

    error = sfnt_open_font( stream, face );
    if ( error )
      return error;

    /* Stream may have changed in sfnt_open_font. */
    stream = face->root.stream;

    FT_TRACE2(( "sfnt_init_face: %08p, %d\n", face, face_instance_index ));

    face_index = FT_ABS( face_instance_index ) & 0xFFFF;

    /* value -(N+1) requests information on index N */
    if ( face_instance_index < 0 )
      face_index--;

    if ( face_index >= face->ttc_header.count )
    {
      if ( face_instance_index >= 0 )
        return FT_THROW( Invalid_Argument );
      else
        face_index = 0;
    }

    if ( FT_STREAM_SEEK( face->ttc_header.offsets[face_index] ) )
      return error;

    /* check whether we have a valid TrueType file */
    error = sfnt->load_font_dir( face, stream );
    if ( error )
      return error;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    {
      FT_Memory  memory = face->root.memory;

      FT_ULong  fvar_len;

      FT_ULong  version;
      FT_ULong  offset;

      FT_UShort  num_axes;
      FT_UShort  axis_size;
      FT_UShort  num_instances;
      FT_UShort  instance_size;

      FT_Int  instance_index;

      FT_Byte*  default_values  = NULL;
      FT_Byte*  instance_values = NULL;


      instance_index = FT_ABS( face_instance_index ) >> 16;

      /* test whether current face is a GX font with named instances */
      if ( face->goto_table( face, TTAG_fvar, stream, &fvar_len ) ||
           fvar_len < 20                                          ||
           FT_READ_ULONG( version )                               ||
           FT_READ_USHORT( offset )                               ||
           FT_STREAM_SKIP( 2 ) /* reserved */                     ||
           FT_READ_USHORT( num_axes )                             ||
           FT_READ_USHORT( axis_size )                            ||
           FT_READ_USHORT( num_instances )                        ||
           FT_READ_USHORT( instance_size )                        )
      {
        version       = 0;
        offset        = 0;
        num_axes      = 0;
        axis_size     = 0;
        num_instances = 0;
        instance_size = 0;
      }

      /* check that the data is bound by the table length */
      if ( version != 0x00010000UL                    ||
           axis_size != 20                            ||
           num_axes == 0                              ||
           /* `num_axes' limit implied by 16-bit `instance_size' */
           num_axes > 0x3FFE                          ||
           !( instance_size == 4 + 4 * num_axes ||
              instance_size == 6 + 4 * num_axes )     ||
           /* `num_instances' limit implied by limited range of name IDs */
           num_instances > 0x7EFF                     ||
           offset                          +
             axis_size * num_axes          +
             instance_size * num_instances > fvar_len )
        num_instances = 0;
      else
        face->variation_support |= TT_FACE_FLAG_VAR_FVAR;

      /*
       *  As documented in the OpenType specification, an entry for the
       *  default instance may be omitted in the named instance table.  In
       *  particular this means that even if there is no named instance
       *  table in the font we actually do have a named instance, namely the
       *  default instance.
       *
       *  For consistency, we always want the default instance in our list
       *  of named instances.  If it is missing, we try to synthesize it
       *  later on.  Here, we have to adjust `num_instances' accordingly.
       */

      if ( ( face->variation_support & TT_FACE_FLAG_VAR_FVAR ) &&
           !( FT_ALLOC( default_values, num_axes * 4 )  ||
              FT_ALLOC( instance_values, num_axes * 4 ) )      )
      {
        /* the current stream position is 16 bytes after the table start */
        FT_ULong  array_start = FT_STREAM_POS() - 16 + offset;
        FT_ULong  default_value_offset, instance_offset;

        FT_Byte*  p;
        FT_UInt   i;


        default_value_offset = array_start + 8;
        p                    = default_values;

        for ( i = 0; i < num_axes; i++ )
        {
          (void)FT_STREAM_READ_AT( default_value_offset, p, 4 );

          default_value_offset += axis_size;
          p                    += 4;
        }

        instance_offset = array_start + axis_size * num_axes + 4;

        for ( i = 0; i < num_instances; i++ )
        {
          (void)FT_STREAM_READ_AT( instance_offset,
                                   instance_values,
                                   num_axes * 4 );

          if ( !ft_memcmp( default_values, instance_values, num_axes * 4 ) )
            break;

          instance_offset += instance_size;
        }

        if ( i == num_instances )
        {
          /* no default instance in named instance table; */
          /* we thus have to synthesize it                */
          num_instances++;
        }
      }

      FT_FREE( default_values );
      FT_FREE( instance_values );

      /* we don't support Multiple Master CFFs yet; */
      /* note that `glyf' or `CFF2' have precedence */
      if ( face->goto_table( face, TTAG_glyf, stream, 0 ) &&
           face->goto_table( face, TTAG_CFF2, stream, 0 ) &&
           !face->goto_table( face, TTAG_CFF, stream, 0 ) )
        num_instances = 0;

      /* instance indices in `face_instance_index' start with index 1, */
      /* thus `>' and not `>='                                         */
      if ( instance_index > num_instances )
      {
        if ( face_instance_index >= 0 )
          return FT_THROW( Invalid_Argument );
        else
          num_instances = 0;
      }

      face->root.style_flags = (FT_Long)num_instances << 16;
    }
#endif

    face->root.num_faces  = face->ttc_header.count;
    face->root.face_index = face_instance_index;

    return error;
  }